

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.h
# Opt level: O2

void __thiscall dlib::error::error(error *this,error_type t,string *a)

{
  *(undefined ***)this = &PTR__error_001fa430;
  std::__cxx11::string::string((string *)&this->info,(string *)a);
  this->type = t;
  return;
}

Assistant:

error(
            error_type t,
            const std::string& a
        ): info(a), type(t) {}